

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_l10n.c
# Opt level: O2

void test_l10n_heap(CuTest *tc)

{
  l10n_text *plVar1;
  char *pcVar2;
  char buffer [32];
  
  plVar1 = l10n_text_create();
  CuAssert_Line(tc,
                "/workspace/llm4binary/github/license_c_cmakelists/ennorehling[P]clibs/test_l10n.c",
                0xd,"null pointer unexpected",(uint)(plVar1 != (l10n_text *)0x0));
  CuAssertIntEquals_LineMsg
            (tc,"/workspace/llm4binary/github/license_c_cmakelists/ennorehling[P]clibs/test_l10n.c",
             0xe,(char *)0x0,1,plVar1->refcount);
  pcVar2 = l10n_text_render(plVar1,buffer,0x20);
  CuAssertPtrEquals_LineMsg
            (tc,"/workspace/llm4binary/github/license_c_cmakelists/ennorehling[P]clibs/test_l10n.c",
             0xf,(char *)0x0,buffer,pcVar2);
  CuAssertStrEquals_LineMsg
            (tc,"/workspace/llm4binary/github/license_c_cmakelists/ennorehling[P]clibs/test_l10n.c",
             0x10,(char *)0x0,"",buffer);
  l10n_text_assign(plVar1,"$name\'s blog (%num stars)","$name","Enno","%num",0x2a,0);
  pcVar2 = l10n_text_render(plVar1,buffer,0x20);
  CuAssertPtrEquals_LineMsg
            (tc,"/workspace/llm4binary/github/license_c_cmakelists/ennorehling[P]clibs/test_l10n.c",
             0x12,(char *)0x0,buffer,pcVar2);
  CuAssertStrEquals_LineMsg
            (tc,"/workspace/llm4binary/github/license_c_cmakelists/ennorehling[P]clibs/test_l10n.c",
             0x13,(char *)0x0,"Enno\'s blog (42 stars)",buffer);
  plVar1 = l10n_text_release(plVar1);
  CuAssertPtrEquals_LineMsg
            (tc,"/workspace/llm4binary/github/license_c_cmakelists/ennorehling[P]clibs/test_l10n.c",
             0x15,(char *)0x0,(void *)0x0,plVar1);
  return;
}

Assistant:

static void test_l10n_heap(CuTest * tc)
{
    char buffer[32];
    l10n_text *txt;

    txt = l10n_text_create();
    CuAssertPtrNotNull(tc, txt);
    CuAssertIntEquals(tc, 1, txt->refcount);
    CuAssertPtrEquals(tc, buffer, l10n_text_render(txt, buffer, sizeof(buffer)));
    CuAssertStrEquals(tc, "", buffer);
    l10n_text_assign(txt, "$name's blog (%num stars)", "$name", "Enno", "%num", 42, NULL);
    CuAssertPtrEquals(tc, buffer, l10n_text_render(txt, buffer, sizeof(buffer)));
    CuAssertStrEquals(tc, "Enno's blog (42 stars)", buffer);
    txt = l10n_text_release(txt);
    CuAssertPtrEquals(tc, NULL, txt);
}